

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

OPJ_BOOL opj_set_warning_handler(opj_codec_t *p_codec,opj_msg_callback p_callback,void *p_user_data)

{
  opj_codec_private_t *l_codec;
  void *p_user_data_local;
  opj_msg_callback p_callback_local;
  opj_codec_t *p_codec_local;
  
  if (p_codec != (opj_codec_t *)0x0) {
    p_codec[0x11] = p_callback;
    p_codec[0xe] = p_user_data;
  }
  p_codec_local._4_4_ = (uint)(p_codec != (opj_codec_t *)0x0);
  return p_codec_local._4_4_;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_warning_handler(opj_codec_t * p_codec,
        opj_msg_callback p_callback,
        void * p_user_data)
{
    opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;
    if (! l_codec) {
        return OPJ_FALSE;
    }

    l_codec->m_event_mgr.warning_handler = p_callback;
    l_codec->m_event_mgr.m_warning_data = p_user_data;

    return OPJ_TRUE;
}